

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ScalarNode *scalar)

{
  StringRef local_140;
  undefined1 local_130 [8];
  SmallString<256U> storage;
  ScalarNode *scalar_local;
  BuildFileImpl *this_local;
  
  storage.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
       scalar;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_130);
  local_140 = llvm::yaml::ScalarNode::getValue
                        ((ScalarNode *)
                         storage.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                         InlineElts._248_8_,(SmallVectorImpl<char> *)local_130);
  llvm::StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_140);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string stringFromScalarNode(llvm::yaml::ScalarNode* scalar) {
    SmallString<256> storage;
    return scalar->getValue(storage).str();
  }